

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *ip;
  int *pInLimit;
  long *plVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  U32 UVar4;
  U32 *pUVar5;
  seqDef *psVar6;
  undefined8 uVar7;
  uint uVar8;
  U32 lowestValid;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ZSTD_matchState_t *ms_00;
  int iVar19;
  BYTE *pBVar20;
  seqStore_t *psVar21;
  size_t offbaseFound;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  int *local_a0;
  uint local_94;
  int *local_90;
  ulong local_88;
  int *local_80;
  int *local_78;
  ZSTD_matchState_t *local_70;
  BYTE *local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  seqStore_t *local_50;
  size_t local_48;
  BYTE *local_40;
  uint *local_38;
  
  local_68 = (ms->window).base;
  uVar16 = (ms->window).dictLimit;
  local_40 = local_68 + uVar16;
  local_b0 = (ms->cParams).minMatch;
  if (5 < local_b0) {
    local_b0 = 6;
  }
  if (local_b0 < 5) {
    local_b0 = 4;
  }
  local_94 = (ms->cParams).searchLog;
  local_a4 = 6;
  if (local_94 < 6) {
    local_a4 = local_94;
  }
  if (local_a4 < 5) {
    local_a4 = 4;
  }
  piVar13 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar19 = (int)piVar13 - (int)local_68;
  local_5c = *rep;
  local_58 = iVar19 - uVar14;
  if (iVar19 - uVar16 <= uVar14) {
    local_58 = uVar16;
  }
  uVar14 = 0;
  if (ms->loadedDictEnd != 0) {
    local_58 = uVar16;
  }
  local_60 = rep[1];
  local_58 = iVar19 - local_58;
  local_a8 = local_60;
  if (local_58 < local_60) {
    local_a8 = uVar14;
  }
  local_ac = local_5c;
  if (local_58 < local_5c) {
    local_ac = uVar14;
  }
  ms->lazySkipping = 0;
  local_78 = (int *)((long)src + (srcSize - 0x10));
  uVar18 = (ulong)ms->nextToUpdate;
  uVar16 = ((int)local_78 - (int)(local_68 + uVar18)) + 1;
  if (7 < uVar16) {
    uVar16 = 8;
  }
  if (local_78 < local_68 + uVar18) {
    uVar16 = uVar14;
  }
  pInLimit = (int *)((long)src + srcSize);
  local_88 = (ulong)(uVar16 + ms->nextToUpdate);
  UVar4 = ms->rowHashLog;
  local_80 = (int *)(ulong)(0x38 - UVar4);
  local_90 = (int *)CONCAT44(local_90._4_4_,0x18 - UVar4);
  local_48 = 1L << ((byte)local_a4 & 0x3f);
  pUVar5 = ms->hashTable;
  pBVar20 = ms->tagTable;
  local_a0 = (int *)src;
  local_70 = ms;
  local_50 = seqStore;
  local_38 = rep;
  for (; uVar18 < local_88; uVar18 = uVar18 + 1) {
    if (0x20 < UVar4 + 8) {
LAB_0018ac5e:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    plVar1 = (long *)(local_68 + uVar18);
    uVar10 = local_70->hashSalt;
    if (local_b0 == 5) {
      sVar9 = (*plVar1 * -0x30e4432345000000 ^ uVar10) >> ((byte)local_80 & 0x3f);
    }
    else if (local_b0 == 6) {
      sVar9 = ZSTD_hash6PtrS(plVar1,UVar4 + 8,uVar10);
    }
    else {
      sVar9 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar10) >> ((byte)local_90 & 0x1f));
    }
    uVar16 = ((uint)(sVar9 >> 8) & 0xffffff) << ((byte)local_a4 & 0x1f);
    if (((ulong)(pUVar5 + uVar16) & 0x3f) != 0) {
LAB_0018ac7d:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a2,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    iVar19 = ZSTD_isAligned(pBVar20 + uVar16,local_48);
    if (iVar19 == 0) {
LAB_0018ac9c:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a3,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    local_70->hashCache[(uint)uVar18 & 7] = (U32)sVar9;
  }
  local_80 = pInLimit + -8;
  ms_00 = local_70;
  uVar14 = local_b0;
  uVar17 = local_a4;
  uVar16 = local_a8;
  do {
    local_a8 = uVar16;
    local_88 = -(ulong)local_ac;
    while( true ) {
      if (local_78 <= piVar13) {
        if (local_60 <= local_58) {
          local_60 = 0;
        }
        uVar16 = local_60;
        if (local_ac != 0) {
          uVar16 = local_5c;
        }
        if (local_5c <= local_58) {
          uVar16 = local_60;
          local_5c = 0;
        }
        if (local_ac != 0) {
          local_5c = local_ac;
        }
        if (local_a8 != 0) {
          uVar16 = local_a8;
        }
        *local_38 = local_5c;
        local_38[1] = uVar16;
        return (long)pInLimit - (long)local_a0;
      }
      if (local_ac == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        if (*(int *)((long)piVar13 + local_88 + 1) == *(int *)((long)piVar13 + 1)) {
          sVar9 = ZSTD_count((BYTE *)((long)piVar13 + 5),(BYTE *)((long)piVar13 + local_88 + 5),
                             (BYTE *)pInLimit);
          uVar18 = sVar9 + 4;
        }
      }
      offbaseFound = 999999999;
      if (uVar14 == 6) {
        if (uVar17 == 6) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_6_6
                             (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar17 == 5) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_6_5
                             (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_noDict_6_4
                             (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar14 == 5) {
        if (uVar17 == 6) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_5_6
                             (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar17 == 5) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_5_5
                             (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_noDict_5_4
                             (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar17 == 6) {
        uVar10 = ZSTD_RowFindBestMatch_noDict_4_6
                           (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (uVar17 == 5) {
        uVar10 = ZSTD_RowFindBestMatch_noDict_4_5
                           (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar10 = ZSTD_RowFindBestMatch_noDict_4_4
                           (ms_00,(BYTE *)piVar13,(BYTE *)pInLimit,&offbaseFound);
      }
      uVar11 = uVar18;
      if (uVar18 < uVar10) {
        uVar11 = uVar10;
      }
      if (3 < uVar11) break;
      uVar18 = (long)piVar13 - (long)local_a0;
      piVar13 = (int *)((long)piVar13 + (uVar18 >> 8) + 1);
      ms_00->lazySkipping = (uint)(0x7ff < uVar18);
    }
    local_90 = (int *)((long)piVar13 + 1);
    uVar15 = 1;
    if (uVar18 < uVar10) {
      local_90 = piVar13;
      uVar15 = offbaseFound;
    }
    for (pBVar20 = (BYTE *)((long)piVar13 + 5); uVar18 = uVar11, pBVar20 + -5 < local_78;
        pBVar20 = pBVar20 + 1) {
      ip = (int *)(pBVar20 + -4);
      if (uVar15 == 0) {
        uVar15 = 0;
      }
      else if ((local_ac != 0) && (*(int *)(pBVar20 + -4) == *(int *)(pBVar20 + (local_88 - 4)))) {
        sVar9 = ZSTD_count(pBVar20,pBVar20 + local_88,(BYTE *)pInLimit);
        uVar14 = local_b0;
        uVar17 = local_a4;
        if (sVar9 < 0xfffffffffffffffc) {
          uVar16 = 0x1f;
          if ((uint)uVar15 != 0) {
            for (; (uint)uVar15 >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          if ((int)((uVar16 ^ 0x1f) + (int)uVar11 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
            uVar15 = 1;
            uVar18 = sVar9 + 4;
            local_90 = ip;
          }
        }
      }
      offbaseFound = 999999999;
      if (uVar14 == 6) {
        if (uVar17 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_6(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else if (uVar17 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_5(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_noDict_6_4(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
      }
      else if (uVar14 == 5) {
        if (uVar17 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_6(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else if (uVar17 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_5(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_noDict_5_4(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound)
          ;
        }
      }
      else if (uVar17 == 6) {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_6(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else if (uVar17 == 5) {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_5(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_noDict_4_4(ms_00,(BYTE *)ip,(BYTE *)pInLimit,&offbaseFound);
      }
      uVar14 = local_b0;
      if (uVar11 < 4) break;
      uVar16 = 0x1f;
      if ((uint)uVar15 != 0) {
        for (; (uint)uVar15 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      iVar19 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar19 == 0; iVar19 = iVar19 + -1) {
        }
      }
      if ((int)uVar11 * 4 - iVar19 <= (int)((uVar16 ^ 0x1f) + (int)uVar18 * 4 + -0x1b)) break;
      piVar13 = (int *)((long)piVar13 + 1);
      uVar15 = offbaseFound;
      local_90 = piVar13;
    }
    psVar21 = local_50;
    piVar13 = local_90;
    uVar16 = local_a8;
    if (3 < uVar15) {
      for (; ((local_a0 < piVar13 && (local_40 < (BYTE *)((long)piVar13 + (3 - uVar15)))) &&
             (*(BYTE *)((long)piVar13 + -1) == *(BYTE *)((long)piVar13 + (2 - uVar15))));
          piVar13 = (int *)((long)piVar13 + -1)) {
        uVar18 = uVar18 + 1;
      }
      uVar16 = local_ac;
      local_ac = (U32)uVar15 - 3;
    }
    if (local_50->maxNbSeq <=
        (ulong)((long)local_50->sequences - (long)local_50->sequencesStart >> 3)) {
LAB_0018acf9:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_a8 = uVar16;
    if (0x20000 < local_50->maxNbLit) {
LAB_0018ad37:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar10 = (long)piVar13 - (long)local_a0;
    pBVar20 = local_50->lit;
    if (local_50->litStart + local_50->maxNbLit < pBVar20 + uVar10) {
LAB_0018ad18:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < piVar13) {
LAB_0018acda:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_90 = piVar13;
    if (local_80 < piVar13) {
      ZSTD_safecopyLiterals(pBVar20,(BYTE *)local_a0,(BYTE *)piVar13,(BYTE *)local_80);
      uVar14 = local_b0;
LAB_0018a880:
      psVar21->lit = psVar21->lit + uVar10;
      if (0xffff < uVar10) {
        if (psVar21->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar21->longLengthType = ZSTD_llt_literalLength;
        psVar21->longLengthPos =
             (U32)((ulong)((long)psVar21->sequences - (long)psVar21->sequencesStart) >> 3);
      }
    }
    else {
      uVar7 = *(undefined8 *)(local_a0 + 2);
      *(undefined8 *)pBVar20 = *(undefined8 *)local_a0;
      *(undefined8 *)(pBVar20 + 8) = uVar7;
      pBVar20 = local_50->lit;
      if (0x10 < uVar10) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar20 + 0x10 + (-0x10 - (long)(local_a0 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar7 = *(undefined8 *)(local_a0 + 6);
        *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(local_a0 + 4);
        *(undefined8 *)(pBVar20 + 0x18) = uVar7;
        if (0x20 < (long)uVar10) {
          lVar12 = 0;
          do {
            puVar3 = (undefined8 *)((long)local_a0 + lVar12 + 0x20);
            uVar7 = puVar3[1];
            pBVar2 = pBVar20 + lVar12 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar7;
            puVar3 = (undefined8 *)((long)local_a0 + lVar12 + 0x30);
            uVar7 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar7;
            lVar12 = lVar12 + 0x20;
          } while (pBVar2 + 0x20 < pBVar20 + uVar10);
        }
        goto LAB_0018a880;
      }
      local_50->lit = pBVar20 + uVar10;
    }
    psVar6 = psVar21->sequences;
    psVar6->litLength = (U16)uVar10;
    psVar6->offBase = (U32)uVar15;
    if (uVar18 < 3) {
LAB_0018acbb:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar18 - 3) {
      if (psVar21->longLengthType != ZSTD_llt_none) {
LAB_0018ad56:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar21->longLengthType = ZSTD_llt_matchLength;
      psVar21->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar21->sequencesStart) >> 3);
    }
    psVar6->mlBase = (U16)(uVar18 - 3);
    psVar21->sequences = psVar6 + 1;
    if (ms_00->lazySkipping != 0) {
      piVar13 = (int *)(ulong)ms_00->nextToUpdate;
      UVar4 = ms_00->rowHashLog;
      uVar16 = ((int)local_78 - (int)(local_68 + (long)piVar13)) + 1;
      if (7 < uVar16) {
        uVar16 = 8;
      }
      if (local_78 < local_68 + (long)piVar13) {
        uVar16 = 0;
      }
      pUVar5 = ms_00->hashTable;
      pBVar20 = ms_00->tagTable;
      local_a0 = (int *)(ulong)(uVar16 + ms_00->nextToUpdate);
      local_88 = (ulong)(0x38 - UVar4);
      local_54 = 0x18 - UVar4;
      for (; piVar13 < local_a0; piVar13 = (int *)((long)piVar13 + 1)) {
        if (0x20 < UVar4 + 8) goto LAB_0018ac5e;
        plVar1 = (long *)(local_68 + (long)piVar13);
        uVar10 = ms_00->hashSalt;
        if (local_b0 == 5) {
          sVar9 = (*plVar1 * -0x30e4432345000000 ^ uVar10) >> ((byte)local_88 & 0x3f);
        }
        else if (local_b0 == 6) {
          sVar9 = ZSTD_hash6PtrS(plVar1,UVar4 + 8,uVar10);
        }
        else {
          sVar9 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar10) >> ((byte)local_54 & 0x1f));
        }
        uVar16 = ((uint)(sVar9 >> 8) & 0xffffff) << ((byte)local_a4 & 0x1f);
        if (((ulong)(pUVar5 + uVar16) & 0x3f) != 0) goto LAB_0018ac7d;
        iVar19 = ZSTD_isAligned(pBVar20 + uVar16,local_48);
        if (iVar19 == 0) goto LAB_0018ac9c;
        local_70->hashCache[(uint)piVar13 & 7] = (U32)sVar9;
        ms_00 = local_70;
      }
      ms_00->lazySkipping = 0;
      psVar21 = local_50;
      uVar14 = local_b0;
      uVar17 = local_a4;
    }
    piVar13 = (int *)((long)local_90 + uVar18);
    uVar8 = local_a8;
    while (((uVar16 = uVar8, local_a0 = piVar13, uVar16 != 0 && (piVar13 <= local_78)) &&
           (*piVar13 == *(int *)((long)piVar13 - (ulong)uVar16)))) {
      sVar9 = ZSTD_count((BYTE *)(piVar13 + 1),(BYTE *)((long)piVar13 + (4 - (ulong)uVar16)),
                         (BYTE *)pInLimit);
      if (psVar21->maxNbSeq <=
          (ulong)((long)psVar21->sequences - (long)psVar21->sequencesStart >> 3)) goto LAB_0018acf9;
      if (0x20000 < psVar21->maxNbLit) goto LAB_0018ad37;
      pBVar20 = psVar21->lit;
      if (psVar21->litStart + psVar21->maxNbLit < pBVar20) goto LAB_0018ad18;
      if (pInLimit < local_a0) goto LAB_0018acda;
      if (local_80 < local_a0) {
        ZSTD_safecopyLiterals(pBVar20,(BYTE *)local_a0,(BYTE *)local_a0,(BYTE *)local_80);
      }
      else {
        uVar7 = *(undefined8 *)(local_a0 + 2);
        *(undefined8 *)pBVar20 = *(undefined8 *)local_a0;
        *(undefined8 *)(pBVar20 + 8) = uVar7;
      }
      psVar6 = psVar21->sequences;
      psVar6->litLength = 0;
      psVar6->offBase = 1;
      if (sVar9 + 4 < 3) goto LAB_0018acbb;
      if (0xffff < sVar9 + 1) {
        if (psVar21->longLengthType != ZSTD_llt_none) goto LAB_0018ad56;
        psVar21->longLengthType = ZSTD_llt_matchLength;
        psVar21->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar21->sequencesStart) >> 3);
      }
      psVar6->mlBase = (U16)(sVar9 + 1);
      psVar21->sequences = psVar6 + 1;
      uVar8 = local_ac;
      local_ac = uVar16;
      piVar13 = (int *)((long)local_a0 + sVar9 + 4);
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_noDict);
}